

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void writeout_results(FILE *fh,AppCtx *ctx,_Bool success,Instance *instance,Solution *solution,
                     SolveStatus status,Timing timing)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined1 local_68 [8];
  TimeRepr solve_time_repr;
  double profit;
  double demand;
  double cost;
  _Bool valid;
  _Bool primal_sol_avail;
  SolveStatus status_local;
  Solution *solution_local;
  Instance *instance_local;
  _Bool success_local;
  AppCtx *ctx_local;
  FILE *fh_local;
  
  bVar2 = (status & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) != SOLVE_STATUS_NULL;
  bVar3 = (status & SOLVE_STATUS_ERR) == SOLVE_STATUS_NULL;
  fprintf((FILE *)fh,"%-16s %s\n","SOLVER:",ctx->solver);
  fprintf((FILE *)fh,"%-16s %f\n",ctx->timelimit,"TIMELIM:");
  fprintf((FILE *)fh,"%-16s %d\n","SEED:",(ulong)(uint)ctx->randomseed);
  fprintf((FILE *)fh,"%-16s %s\n","INPUT:",ctx->instance_filepath);
  fprintf((FILE *)fh,"%-16s %.17g\n",instance->vehicle_cap,"VEHICLE_CAP:");
  fprintf((FILE *)fh,"%-16s 0x%x\n","STATUS:",(ulong)status);
  if (status != SOLVE_STATUS_NULL && bVar3) {
    printf("%-16s [%.17g, %.17g]\n",solution->dual_bound,solution->primal_bound,"BOUNDS:");
    solution_relgap(solution);
    printf("%-16s %.17g\n","GAP");
    if (bVar2) {
      print_tour(&solution->tour);
    }
  }
  else {
    printf("%-16s Could not solve\n","ERR:");
  }
  if ((bVar2) && (status != SOLVE_STATUS_NULL && bVar3)) {
    dVar4 = tour_eval(instance,&solution->tour);
    dVar5 = tour_demand(instance,&solution->tour);
    solve_time_repr._16_8_ = tour_profit(instance,&solution->tour);
    printf("%-16s %.17g\n",dVar4,"TOUR COST:");
    printf("%-16s %.17g\n",solve_time_repr._16_8_,"TOUR PROFIT:");
    printf("%-16s %.17g   (%.3g%%)\n",dVar5,(dVar5 / instance->vehicle_cap) * 100.0,"TOUR DEMAND:");
  }
  pcVar1 = ctime(&timing.started);
  printf("%-16s %s","STARTED:",pcVar1);
  pcVar1 = ctime(&timing.ended);
  printf("%-16s %s","ENDED:",pcVar1);
  printf("%-16s ","TOOK:");
  timerepr_from_usecs((TimeRepr *)local_68,timing.took_usecs);
  print_timerepr(_stdout,(TimeRepr *)local_68);
  printf("\n");
  pcVar1 = "FALSE";
  if (success) {
    pcVar1 = "TRUE";
  }
  printf("%-16s %s\n","SUCCESS",pcVar1);
  return;
}

Assistant:

static void writeout_results(FILE *fh, AppCtx *ctx, bool success,
                             Instance *instance, Solution *solution,
                             SolveStatus status, Timing timing) {
    bool primal_sol_avail = BOOL(status & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL);
    bool valid = status != 0 && !BOOL(status & SOLVE_STATUS_ERR);

    fprintf(fh, "%-16s %s\n", "SOLVER:", ctx->solver);
    fprintf(fh, "%-16s %f\n", "TIMELIM:", ctx->timelimit);
    fprintf(fh, "%-16s %d\n", "SEED:", ctx->randomseed);
    fprintf(fh, "%-16s %s\n", "INPUT:", ctx->instance_filepath);
    fprintf(fh, "%-16s %.17g\n", "VEHICLE_CAP:", instance->vehicle_cap);

    fprintf(fh, "%-16s 0x%x\n", "STATUS:", status);

    if (valid) {
        printf("%-16s [%.17g, %.17g]\n", "BOUNDS:", solution->dual_bound,
               solution->primal_bound);
        printf("%-16s %.17g\n", "GAP", solution_relgap(solution));
        if (primal_sol_avail) {
            print_tour(&solution->tour);
        }
    } else if (!valid) {
        printf("%-16s Could not solve\n", "ERR:");
    }

    if (primal_sol_avail && valid) {
        double cost = tour_eval(instance, &solution->tour);
        double demand = tour_demand(instance, &solution->tour);
        double profit = tour_profit(instance, &solution->tour);
        printf("%-16s %.17g\n", "TOUR COST:", cost);
        printf("%-16s %.17g\n", "TOUR PROFIT:", profit);
        printf("%-16s %.17g   (%.3g%%)\n", "TOUR DEMAND:", demand,
               demand / instance->vehicle_cap * 100.0);
    }

    printf("%-16s %s", "STARTED:", ctime(&timing.started));
    printf("%-16s %s", "ENDED:", ctime(&timing.ended));
    printf("%-16s ", "TOOK:");

    TimeRepr solve_time_repr = timerepr_from_usecs(timing.took_usecs);
    print_timerepr(stdout, &solve_time_repr);
    printf("\n");

    printf("%-16s %s\n", "SUCCESS", success ? "TRUE" : "FALSE");
}